

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O3

int regstrcmp(SXML_CHAR *str,SXML_CHAR *pattern)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  
  iVar3 = 1;
  if ((str != (SXML_CHAR *)0x0 || pattern != (SXML_CHAR *)0x0) &&
     (iVar3 = 0, str != (SXML_CHAR *)0x0 && pattern != (SXML_CHAR *)0x0)) {
LAB_0010640c:
    do {
      bVar4 = *pattern;
      if (bVar4 < 0x3f) {
        if (bVar4 == 0x2a) {
          while ((bVar4 == 0x2a || (bVar4 == 0x3f))) {
            pbVar1 = (byte *)pattern + 1;
            pattern = (SXML_CHAR *)((byte *)pattern + 1);
            bVar4 = *pbVar1;
          }
          str = (SXML_CHAR *)((byte *)str + -1);
          do {
            pbVar1 = (byte *)str + 1;
            str = (SXML_CHAR *)((byte *)str + 1);
            if (*pbVar1 == 0) break;
          } while (*pbVar1 != bVar4);
          goto LAB_0010640c;
        }
        if (bVar4 == 0) {
          return (int)(*str == 0);
        }
      }
      else {
        if (bVar4 == 0x3f) {
          pattern = (SXML_CHAR *)((byte *)pattern + 1);
          str = (SXML_CHAR *)((byte *)str + 1);
          goto LAB_0010640c;
        }
        if (bVar4 == 0x5c) {
          bVar4 = ((byte *)pattern)[1];
          pattern = (SXML_CHAR *)((byte *)pattern + 1);
        }
      }
      pattern = (SXML_CHAR *)((byte *)pattern + 1);
      bVar2 = *str;
      str = (SXML_CHAR *)((byte *)str + 1);
    } while (bVar4 == bVar2);
  }
  return iVar3;
}

Assistant:

int regstrcmp(SXML_CHAR* str, SXML_CHAR* pattern)
{
	SXML_CHAR *p, *s;

	if (str == NULL && pattern == NULL)
		return TRUE;

	if (str == NULL || pattern == NULL)
		return FALSE;

	p = pattern;
	s = str;
	for (;;) {
		switch (*p) {
			/* Any character matches, go to next one */
			case C2SX('?'):
				p++;
				s++;
				break;

			/* Go to next character in pattern and wait until it is found in 'str' */
			case C2SX('*'):
				for (; *p != NULC; p++) { /* Squeeze '**?*??**' to '*' */
					if (*p != C2SX('*') && *p != C2SX('?'))
						break;
				}
				for (; *s != NULC; s++) {
					if (*s == *p)
						break;
				}
				break;

			/* NULL character on pattern has to be matched by 'str' */
			case 0:
				return *s ? FALSE : TRUE;

			default:
				if (*p == C2SX('\\')) /* Escape character */
					p++;
				if (*p++ != *s++) /* Characters do not match */
					return FALSE;
				break;
		}
	}

	return FALSE;
}